

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialogPrivate::saveHistorySelection(QFileDialogPrivate *this)

{
  bool bVar1;
  QAbstractItemView *this_00;
  qsizetype qVar2;
  reference pHVar3;
  QModelIndex *pQVar4;
  long in_RDI;
  long in_FS_OFFSET;
  QModelIndex *index;
  QModelIndexList *__range1;
  HistoryItem *item;
  const_iterator __end1;
  const_iterator __begin1;
  QModelIndexList selectedIndexes;
  qsizetype in_stack_ffffffffffffff88;
  PersistentModelIndexList *t;
  QPersistentModelIndex local_40;
  QModelIndex *local_38;
  const_iterator local_30;
  const_iterator local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::isNull
                    ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)
                     (in_RDI + 0x370));
  if ((!bVar1) && (-1 < *(int *)(in_RDI + 0x340))) {
    this_00 = (QAbstractItemView *)(long)*(int *)(in_RDI + 0x340);
    qVar2 = QList<QFileDialogPrivate::HistoryItem>::size
                      ((QList<QFileDialogPrivate::HistoryItem> *)(in_RDI + 0x328));
    if ((long)this_00 < qVar2) {
      pHVar3 = QList<QFileDialogPrivate::HistoryItem>::operator[]
                         ((QList<QFileDialogPrivate::HistoryItem> *)this_00,
                          in_stack_ffffffffffffff88);
      QList<QPersistentModelIndex>::clear((QList<QPersistentModelIndex> *)this_00);
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)
                 (in_RDI + 0x370));
      QAbstractItemView::selectionModel(this_00);
      QItemSelectionModel::selectedRows((int)&local_20);
      local_28.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
      local_28 = QList<QModelIndex>::begin((QList<QModelIndex> *)this_00);
      local_30.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
      local_30 = QList<QModelIndex>::end((QList<QModelIndex> *)this_00);
      while( true ) {
        local_38 = local_30.i;
        bVar1 = QList<QModelIndex>::const_iterator::operator!=(&local_28,local_30);
        if (!bVar1) break;
        pQVar4 = QList<QModelIndex>::const_iterator::operator*(&local_28);
        t = &pHVar3->selection;
        QPersistentModelIndex::QPersistentModelIndex(&local_40,(QModelIndex *)pQVar4);
        QList<QPersistentModelIndex>::append((QList<QPersistentModelIndex> *)this_00,(rvalue_ref)t);
        QPersistentModelIndex::~QPersistentModelIndex(&local_40);
        QList<QModelIndex>::const_iterator::operator++(&local_28);
      }
      QList<QModelIndex>::~QList((QList<QModelIndex> *)0x761cb5);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialogPrivate::saveHistorySelection()
{
    if (qFileDialogUi.isNull() || currentHistoryLocation < 0 || currentHistoryLocation >= currentHistory.size())
        return;
    auto &item = currentHistory[currentHistoryLocation];
    item.selection.clear();
    const auto selectedIndexes = qFileDialogUi->listView->selectionModel()->selectedRows();
    for (const auto &index : selectedIndexes)
        item.selection.append(QPersistentModelIndex(index));
}